

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_longest_match_quickly_inc.h
# Opt level: O2

void PrepareH4(HasherHandle handle,int one_shot,size_t input_size,uint8_t *data)

{
  HasherHandle puVar1;
  size_t i;
  size_t sVar2;
  
  if (input_size < 0x1001 && one_shot != 0) {
    for (sVar2 = 0; input_size != sVar2; sVar2 = sVar2 + 1) {
      puVar1 = handle + 0x28 + ((ulong)(*(long *)(data + sVar2) * -0x42e1ca5843000000) >> 0x2f) * 4;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      puVar1[8] = '\0';
      puVar1[9] = '\0';
      puVar1[10] = '\0';
      puVar1[0xb] = '\0';
      puVar1[0xc] = '\0';
      puVar1[0xd] = '\0';
      puVar1[0xe] = '\0';
      puVar1[0xf] = '\0';
    }
    return;
  }
  memset(handle + 0x28,0,0x80010);
  return;
}

Assistant:

static BROTLI_INLINE HashLongestMatchQuickly* FN(Self)(HasherHandle handle) {
  return (HashLongestMatchQuickly*)&(GetHasherCommon(handle)[1]);
}